

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXParser.cpp
# Opt level: O0

void Assimp::FBX::ParseVectorDataArray
               (vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *out,Element *el)

{
  bool bVar1;
  const_reference ppTVar2;
  Element *pEVar3;
  TokenList *pTVar4;
  size_type sVar5;
  reference ppTVar6;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_1c8;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_1c0;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_1b8;
  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
  local_1b0;
  undefined1 local_1a8 [8];
  aiColor4D v;
  const_iterator end_1;
  const_iterator it;
  string local_180;
  allocator<char> local_159;
  string local_158;
  Element *local_138;
  Element *a;
  Scope *scope;
  size_t dim;
  uint local_10c;
  float *pfStack_108;
  uint i_1;
  float *f;
  uint local_ec;
  double *pdStack_e8;
  uint i;
  double *d;
  undefined1 local_d8 [4];
  uint32_t count4;
  vector<char,_std::allocator<char>_> buff;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  uint local_70;
  char local_69;
  uint32_t count;
  char type;
  char *end;
  char *data;
  allocator<char> local_41;
  string local_40;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_20;
  TokenList *tok;
  Element *el_local;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *out_local;
  
  tok = (TokenList *)el;
  el_local = (Element *)out;
  std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::resize(out,0);
  local_20 = Element::Tokens((Element *)tok);
  bVar1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
          empty(local_20);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"unexpected empty element",&local_41);
    anon_unknown.dwarf_d3af7e::ParseError(&local_40,(Element *)tok);
  }
  ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            operator[](local_20,0);
  bVar1 = Token::IsBinary(*ppTVar2);
  if (bVar1) {
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    end = Token::begin(*ppTVar2);
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    _count = Token::end(*ppTVar2);
    anon_unknown_16::ReadBinaryDataArrayHead(&end,_count,&local_69,&local_70,(Element *)tok);
    if ((local_70 & 3) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"number of floats is not a multiple of four (4) (binary)",
                 &local_91);
      anon_unknown.dwarf_d3af7e::ParseError(&local_90,(Element *)tok);
    }
    if (local_70 != 0) {
      if ((local_69 != 'd') && (local_69 != 'f')) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_b8,"expected float or double array (binary)",
                   (allocator<char> *)
                   &buff.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x17);
        anon_unknown.dwarf_d3af7e::ParseError(&local_b8,(Element *)tok);
      }
      std::vector<char,_std::allocator<char>_>::vector
                ((vector<char,_std::allocator<char>_> *)local_d8);
      anon_unknown_16::ReadBinaryDataArray
                (local_69,local_70,&end,_count,(vector<char,_std::allocator<char>_> *)local_d8,
                 (Element *)tok);
      d._4_4_ = local_70 >> 2;
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)el_local,
                 (ulong)d._4_4_);
      if (local_69 == 'd') {
        pdStack_e8 = (double *)
                     std::vector<char,_std::allocator<char>_>::operator[]
                               ((vector<char,_std::allocator<char>_> *)local_d8,0);
        for (local_ec = 0; pEVar3 = el_local, local_ec < d._4_4_; local_ec = local_ec + 1) {
          aiColor4t<float>::aiColor4t
                    ((aiColor4t<float> *)((long)&f + 4),(float)*pdStack_e8,(float)pdStack_e8[1],
                     (float)pdStack_e8[2],(float)pdStack_e8[3]);
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)pEVar3,
                     (value_type *)((long)&f + 4));
          pdStack_e8 = pdStack_e8 + 4;
        }
      }
      else if (local_69 == 'f') {
        pfStack_108 = (float *)std::vector<char,_std::allocator<char>_>::operator[]
                                         ((vector<char,_std::allocator<char>_> *)local_d8,0);
        for (local_10c = 0; pEVar3 = el_local, local_10c < d._4_4_; local_10c = local_10c + 1) {
          aiColor4t<float>::aiColor4t
                    ((aiColor4t<float> *)((long)&dim + 4),*pfStack_108,pfStack_108[1],pfStack_108[2]
                     ,pfStack_108[3]);
          std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                    ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)pEVar3,
                     (value_type *)((long)&dim + 4));
          pfStack_108 = pfStack_108 + 4;
        }
      }
      std::vector<char,_std::allocator<char>_>::~vector
                ((vector<char,_std::allocator<char>_> *)local_d8);
    }
  }
  else {
    ppTVar2 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              operator[](local_20,0);
    scope = (Scope *)ParseTokenAsDim(*ppTVar2);
    std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::reserve
              ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)el_local,
               (size_type)scope);
    pEVar3 = (Element *)GetRequiredScope((Element *)tok);
    a = pEVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"a",&local_159);
    pEVar3 = GetRequiredElement((Scope *)pEVar3,&local_158,(Element *)tok);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    local_138 = pEVar3;
    pTVar4 = Element::Tokens(pEVar3);
    sVar5 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            size(pTVar4);
    if ((sVar5 & 3) != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_180,"number of floats is not a multiple of four (4)",
                 (allocator<char> *)((long)&it._M_current + 7));
      anon_unknown.dwarf_d3af7e::ParseError(&local_180,(Element *)tok);
    }
    pTVar4 = Element::Tokens(local_138);
    end_1 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            begin(pTVar4);
    pTVar4 = Element::Tokens(local_138);
    v._8_8_ = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              end(pTVar4);
    while (bVar1 = __gnu_cxx::operator!=
                             (&end_1,(__normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                                      *)&v.b), bVar1) {
      aiColor4t<float>::aiColor4t((aiColor4t<float> *)local_1a8);
      local_1b0 = __gnu_cxx::
                  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                  ::operator++(&end_1,0);
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                ::operator*(&local_1b0);
      local_1a8._0_4_ = ParseTokenAsFloat(*ppTVar6);
      local_1b8 = __gnu_cxx::
                  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                  ::operator++(&end_1,0);
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                ::operator*(&local_1b8);
      local_1a8._4_4_ = ParseTokenAsFloat(*ppTVar6);
      local_1c0 = __gnu_cxx::
                  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                  ::operator++(&end_1,0);
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                ::operator*(&local_1c0);
      v.r = ParseTokenAsFloat(*ppTVar6);
      local_1c8 = __gnu_cxx::
                  __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                  ::operator++(&end_1,0);
      ppTVar6 = __gnu_cxx::
                __normal_iterator<const_Assimp::FBX::Token_*const_*,_std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>_>
                ::operator*(&local_1c8);
      v.g = ParseTokenAsFloat(*ppTVar6);
      std::vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>::push_back
                ((vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *)el_local,
                 (value_type *)local_1a8);
    }
  }
  return;
}

Assistant:

void ParseVectorDataArray(std::vector<aiColor4D>& out, const Element& el)
{
    out.resize( 0 );
    const TokenList& tok = el.Tokens();
    if(tok.empty()) {
        ParseError("unexpected empty element",&el);
    }

    if(tok[0]->IsBinary()) {
        const char* data = tok[0]->begin(), *end = tok[0]->end();

        char type;
        uint32_t count;
        ReadBinaryDataArrayHead(data, end, type, count, el);

        if(count % 4 != 0) {
            ParseError("number of floats is not a multiple of four (4) (binary)",&el);
        }

        if(!count) {
            return;
        }

        if (type != 'd' && type != 'f') {
            ParseError("expected float or double array (binary)",&el);
        }

        std::vector<char> buff;
        ReadBinaryDataArray(type, count, data, end, buff, el);

        ai_assert(data == end);
        ai_assert(buff.size() == count * (type == 'd' ? 8 : 4));

        const uint32_t count4 = count / 4;
        out.reserve(count4);

        if (type == 'd') {
            const double* d = reinterpret_cast<const double*>(&buff[0]);
            for (unsigned int i = 0; i < count4; ++i, d += 4) {
                out.push_back(aiColor4D(static_cast<float>(d[0]),
                    static_cast<float>(d[1]),
                    static_cast<float>(d[2]),
                    static_cast<float>(d[3])));
            }
        }
        else if (type == 'f') {
            const float* f = reinterpret_cast<const float*>(&buff[0]);
            for (unsigned int i = 0; i < count4; ++i, f += 4) {
                out.push_back(aiColor4D(f[0],f[1],f[2],f[3]));
            }
        }
        return;
    }

    const size_t dim = ParseTokenAsDim(*tok[0]);

    //  see notes in ParseVectorDataArray() above
    out.reserve(dim);

    const Scope& scope = GetRequiredScope(el);
    const Element& a = GetRequiredElement(scope,"a",&el);

    if (a.Tokens().size() % 4 != 0) {
        ParseError("number of floats is not a multiple of four (4)",&el);
    }
    for (TokenList::const_iterator it = a.Tokens().begin(), end = a.Tokens().end(); it != end; ) {
        aiColor4D v;
        v.r = ParseTokenAsFloat(**it++);
        v.g = ParseTokenAsFloat(**it++);
        v.b = ParseTokenAsFloat(**it++);
        v.a = ParseTokenAsFloat(**it++);

        out.push_back(v);
    }
}